

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncoderMD.cpp
# Opt level: O2

void __thiscall
EncoderMD::FixMaps(EncoderMD *this,uint32 brOffset,uint32 bytesSaved,FixUpMapIndex *mapIndices)

{
  uint uVar1;
  List<InlineeFrameRecord_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  List<IR::PragmaInstr_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_02;
  List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_03;
  Encoder *pEVar2;
  uint32 *puVar3;
  uint uVar4;
  Type *ppIVar5;
  Type *pTVar6;
  Type *ppPVar7;
  Type *pTVar8;
  uint32 uVar9;
  
  this_00 = this->m_encoder->m_inlineeFrameRecords;
  for (uVar9 = mapIndices->inlineeFrameRecordsIndex;
      (int)uVar9 <
      (this_00->super_ReadOnlyList<InlineeFrameRecord_*,_Memory::ArenaAllocator,_DefaultComparer>).
      count; uVar9 = uVar9 + 1) {
    ppIVar5 = JsUtil::
              List<InlineeFrameRecord_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_00,uVar9);
    if (brOffset < (*ppIVar5)->inlineeStartOffset) break;
    ppIVar5 = JsUtil::
              List<InlineeFrameRecord_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_00,uVar9);
    (*ppIVar5)->inlineeStartOffset = (*ppIVar5)->inlineeStartOffset - bytesSaved;
  }
  mapIndices->inlineeFrameRecordsIndex = uVar9;
  this_01 = this->m_encoder->m_inlineeFrameMap;
  for (uVar9 = mapIndices->inlineeFrameMapIndex;
      (int)uVar9 <
      (this_01->
      super_ReadOnlyList<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_DefaultComparer>).
      count; uVar9 = uVar9 + 1) {
    pTVar6 = JsUtil::
             List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_01,uVar9);
    if (brOffset < pTVar6->offset) break;
    pTVar6 = JsUtil::
             List<NativeOffsetInlineeFramePair,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_01,uVar9);
    pTVar6->offset = pTVar6->offset - bytesSaved;
  }
  mapIndices->inlineeFrameMapIndex = uVar9;
  this_02 = this->m_encoder->m_pragmaInstrToRecordOffset;
  for (uVar9 = mapIndices->pragmaInstToRecordOffsetIndex;
      (int)uVar9 <
      (this_02->super_ReadOnlyList<IR::PragmaInstr_*,_Memory::ArenaAllocator,_DefaultComparer>).
      count; uVar9 = uVar9 + 1) {
    ppPVar7 = JsUtil::
              List<IR::PragmaInstr_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_02,uVar9);
    if (brOffset < (*ppPVar7)->m_offsetInBuffer) break;
    ppPVar7 = JsUtil::
              List<IR::PragmaInstr_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              ::Item(this_02,uVar9);
    (*ppPVar7)->m_offsetInBuffer = (*ppPVar7)->m_offsetInBuffer - bytesSaved;
  }
  mapIndices->pragmaInstToRecordOffsetIndex = uVar9;
  this_03 = this->m_encoder->m_sortedLazyBailoutRecordList;
  for (uVar9 = mapIndices->lazyBailOutRecordListIndex;
      (int)uVar9 <
      (this_03->super_ReadOnlyList<LazyBailOutRecord,_Memory::ArenaAllocator,_DefaultComparer>).
      count; uVar9 = uVar9 + 1) {
    pTVar8 = JsUtil::
             List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_03,uVar9);
    if (brOffset < pTVar8->offset) break;
    pTVar8 = JsUtil::
             List<LazyBailOutRecord,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_03,uVar9);
    pTVar8->offset = pTVar8->offset - bytesSaved;
  }
  mapIndices->lazyBailOutRecordListIndex = uVar9;
  pEVar2 = this->m_encoder;
  for (uVar4 = mapIndices->offsetBuffIndex; uVar4 < pEVar2->m_instrNumber; uVar4 = uVar4 + 1) {
    puVar3 = pEVar2->m_offsetBuffer;
    uVar1 = puVar3[(int)uVar4];
    if (brOffset < uVar1) break;
    puVar3[(int)uVar4] = uVar1 - bytesSaved;
  }
  mapIndices->offsetBuffIndex = uVar4;
  return;
}

Assistant:

void
EncoderMD::FixMaps(uint32 brOffset, uint32 bytesSaved, FixUpMapIndex *mapIndices)

{
    int32 i;

    {
        InlineeFrameRecords *recList = m_encoder->m_inlineeFrameRecords;
        for (i = mapIndices->inlineeFrameRecordsIndex; i < recList->Count() && recList->Item(i)->inlineeStartOffset <= brOffset; i++)
        {
            recList->Item(i)->inlineeStartOffset -= bytesSaved;
        }

        mapIndices->inlineeFrameRecordsIndex = i;
    }

    {
        ArenaInlineeFrameMap *mapList = m_encoder->m_inlineeFrameMap;
        for (i = mapIndices->inlineeFrameMapIndex; i < mapList->Count() && mapList->Item(i).offset <= brOffset; i++)
        {
            mapList->Item(i).offset -= bytesSaved;
        }

        mapIndices->inlineeFrameMapIndex = i;
    }

    {
        PragmaInstrList *pInstrList = m_encoder->m_pragmaInstrToRecordOffset;
        for (i = mapIndices->pragmaInstToRecordOffsetIndex; i < pInstrList->Count() && pInstrList->Item(i)->m_offsetInBuffer <= brOffset; i++)
        {
            pInstrList->Item(i)->m_offsetInBuffer -= bytesSaved;
        }

        mapIndices->pragmaInstToRecordOffsetIndex = i;
    }

    {
        ArenaLazyBailoutRecordList *lazyBailOutRecordList = m_encoder->m_sortedLazyBailoutRecordList;
        for (i = mapIndices->lazyBailOutRecordListIndex; i < lazyBailOutRecordList->Count() && lazyBailOutRecordList->Item(i).offset <= brOffset; i++)
        {
            lazyBailOutRecordList->Item(i).offset -= bytesSaved;
        }

        mapIndices->lazyBailOutRecordListIndex = i;
    }

#if DBG_DUMP

    {
        for (i = mapIndices->offsetBuffIndex; (uint)i < m_encoder->m_instrNumber && m_encoder->m_offsetBuffer[i] <= brOffset; i++)
        {
            m_encoder->m_offsetBuffer[i] -= bytesSaved;
        }

        mapIndices->offsetBuffIndex = i;
    }

#endif
}